

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int decode_jpeg_header(jpeg *z,int scan)

{
  uint uVar1;
  uint uVar2;
  uint8 uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint8 (*pauVar15) [64];
  int *piVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  
  z->marker = 0xff;
  uVar3 = get_marker(z);
  pcVar18 = "Corrupt JPEG";
  if (uVar3 == 0xd8) {
    if (scan == 1) {
      return 1;
    }
    bVar4 = get_marker(z);
    while ((bVar4 & 0xfe) != 0xc0) {
      iVar5 = process_marker(z,(uint)bVar4);
      if (iVar5 == 0) {
        return 0;
      }
      while (bVar4 = get_marker(z), bVar4 == 0xff) {
        iVar5 = at_eof(&z->s);
        if (iVar5 != 0) {
          failure_reason = pcVar18;
          return 0;
        }
      }
    }
    iVar5 = get16(&z->s);
    if (10 < iVar5) {
      iVar6 = get8(&z->s);
      if (iVar6 == 8) {
        uVar7 = get16(&z->s);
        (z->s).img_y = uVar7;
        if (uVar7 == 0) {
          pcVar18 = "JPEG format not supported: delayed height";
        }
        else {
          uVar7 = get16(&z->s);
          (z->s).img_x = uVar7;
          if ((uVar7 != 0) && (uVar8 = get8(&z->s), (uVar8 & 0xfffffffd) == 1)) {
            (z->s).img_n = uVar8;
            for (lVar14 = 0; (ulong)uVar8 * 0x48 - lVar14 != 0; lVar14 = lVar14 + 0x48) {
              *(undefined8 *)((long)&z->img_comp[0].data + lVar14) = 0;
              *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar14) = 0;
            }
            if (iVar5 == uVar8 * 3 + 8) {
              piVar16 = &z->img_comp[0].tq;
              uVar13 = 0;
              while (uVar8 = (z->s).img_n, (long)uVar13 < (long)(int)uVar8) {
                uVar8 = get8(&z->s);
                ((anon_struct_72_14_dbcb52e3 *)(piVar16 + -3))->id = uVar8;
                if (uVar13 + 1 != (ulong)uVar8 && uVar13 != uVar8) {
                  failure_reason = pcVar18;
                  return 0;
                }
                uVar8 = get8(&z->s);
                piVar16[-2] = (int)uVar8 >> 4;
                if (uVar8 < 0x10) {
                  failure_reason = pcVar18;
                  return 0;
                }
                if (4 < (int)uVar8 >> 4) {
                  failure_reason = pcVar18;
                  return 0;
                }
                piVar16[-1] = uVar8 & 0xf;
                if ((uVar8 & 0xf) - 5 < 0xfffffffc) {
                  failure_reason = pcVar18;
                  return 0;
                }
                iVar5 = get8(&z->s);
                *piVar16 = iVar5;
                piVar16 = piVar16 + 0x12;
                uVar13 = uVar13 + 1;
                if (3 < iVar5) {
                  failure_reason = pcVar18;
                  return 0;
                }
              }
              uVar1 = (z->s).img_x;
              uVar2 = (z->s).img_y;
              uVar13 = 0;
              if ((uint)((0x40000000 / (ulong)uVar1) / (ulong)uVar8) < uVar2) {
                pcVar18 = "Image too large to decode";
              }
              else {
                uVar19 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar19 = uVar13;
                }
                uVar8 = 1;
                uVar17 = 1;
                for (; iVar5 = (int)uVar17, uVar19 * 0x48 - uVar13 != 0; uVar13 = uVar13 + 0x48) {
                  uVar9 = *(uint *)((long)&z->img_comp[0].h + uVar13);
                  uVar10 = *(uint *)((long)&z->img_comp[0].v + uVar13);
                  if ((int)uVar8 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  if (iVar5 < (int)uVar10) {
                    uVar17 = (ulong)uVar10;
                  }
                }
                z->img_h_max = uVar8;
                z->img_v_max = iVar5;
                z->img_mcu_w = uVar8 * 8;
                z->img_mcu_h = iVar5 * 8;
                uVar13 = 0;
                uVar9 = ((uVar1 + uVar8 * 8) - 1) / (uVar8 * 8);
                pauVar15 = (uint8 (*) [64])&z->img_mcu_x;
                z->img_mcu_x = uVar9;
                uVar10 = ((uVar2 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
                z->img_mcu_y = uVar10;
                while( true ) {
                  if (uVar19 == uVar13) {
                    return 1;
                  }
                  iVar6 = *(int *)((long)*pauVar15 + 0x14);
                  iVar12 = *(int *)((long)*pauVar15 + 0x18);
                  *(uint *)((long)*pauVar15 + 0x2c) = (iVar6 * uVar1 + (uVar8 - 1)) / uVar8;
                  *(int *)((long)*pauVar15 + 0x30) = (int)((iVar12 * uVar2 + iVar5 + -1) / uVar17);
                  iVar6 = iVar6 * uVar9 * 8;
                  *(int *)((long)*pauVar15 + 0x34) = iVar6;
                  iVar12 = iVar12 * uVar10 * 8;
                  *(int *)((long)*pauVar15 + 0x38) = iVar12;
                  pvVar11 = malloc((long)(int)(iVar12 * iVar6 | 0xf));
                  *(void **)((long)(pauVar15 + 1) + 8) = pvVar11;
                  if (pvVar11 == (void *)0x0) break;
                  *(ulong *)(pauVar15 + 1) = (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
                  *(undefined8 *)((long)(pauVar15 + 1) + 0x10) = 0;
                  uVar13 = uVar13 + 1;
                  pauVar15 = (uint8 (*) [64])((long)(pauVar15 + 1) + 8);
                }
                for (; pcVar18 = "Out of memory", 0 < (long)uVar13; uVar13 = uVar13 - 1) {
                  free(*(void **)*pauVar15);
                  *(undefined8 *)((long)(pauVar15 + 0xffffffffffffffff) + 0x38) = 0;
                  pauVar15 = (uint8 (*) [64])((long)(pauVar15 + 0xfffffffffffffffe) + 0x38);
                }
              }
            }
          }
        }
      }
      else {
        pcVar18 = "JPEG format not supported: 8-bit only";
      }
    }
  }
  failure_reason = pcVar18;
  return 0;
}

Assistant:

static int decode_jpeg_header(jpeg *z, int scan)
{
   int m;
   z->marker = MARKER_none; // initialize cached marker to empty
   m = get_marker(z);
   if (!SOI(m)) return e("no SOI","Corrupt JPEG");
   if (scan == SCAN_type) return 1;
   m = get_marker(z);
   while (!SOF(m)) {
      if (!process_marker(z,m)) return 0;
      m = get_marker(z);
      while (m == MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (at_eof(&z->s)) return e("no SOF", "Corrupt JPEG");
         m = get_marker(z);
      }
   }
   if (!process_frame_header(z, scan)) return 0;
   return 1;
}